

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O0

bool __thiscall TimeStampReq::Decode(TimeStampReq *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  DecodeResult DVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t *psVar5;
  undefined1 local_58 [8];
  SequenceHelper sh;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  TimeStampReq *this_local;
  
  sh._32_8_ = cbUsed;
  SequenceHelper::SequenceHelper((SequenceHelper *)local_58,cbUsed);
  DVar2 = SequenceHelper::Init((SequenceHelper *)local_58,pIn,cbIn,&(this->super_DerBase).cbData);
  if (DVar2 == Failed) {
    this_local._7_1_ = false;
  }
  else if (DVar2 - Null < 2) {
    this_local._7_1_ = true;
  }
  else {
    puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
    sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
    psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
    bVar1 = Integer::Decode(&this->version,puVar3,sVar4,psVar5);
    if (bVar1) {
      SequenceHelper::Update((SequenceHelper *)local_58);
      puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
      sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
      psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
      bVar1 = MessageImprint::Decode(&this->messageImprint,puVar3,sVar4,psVar5);
      if (bVar1) {
        SequenceHelper::Update((SequenceHelper *)local_58);
        puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
        sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
        psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
        bVar1 = ObjectIdentifier::Decode(&this->reqPolicy,puVar3,sVar4,psVar5);
        if (bVar1) {
          SequenceHelper::Update((SequenceHelper *)local_58);
          puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
          sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
          psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
          bVar1 = Integer::Decode(&this->nonce,puVar3,sVar4,psVar5);
          if (bVar1) {
            SequenceHelper::Update((SequenceHelper *)local_58);
            puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
            sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
            psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
            bVar1 = Boolean::Decode(&this->certReq,puVar3,sVar4,psVar5);
            if (bVar1) {
              SequenceHelper::Update((SequenceHelper *)local_58);
              puVar3 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
              sVar4 = SequenceHelper::DataSize((SequenceHelper *)local_58);
              psVar5 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
              bVar1 = Extensions::Decode(&this->extensions,puVar3,sVar4,psVar5);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  SequenceHelper::~SequenceHelper((SequenceHelper *)local_58);
  return this_local._7_1_;
}

Assistant:

bool TimeStampReq::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    if (!version.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!messageImprint.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!reqPolicy.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!nonce.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!certReq.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!extensions.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    return true;
}